

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void __thiscall
front::irGenerator::irGenerator::ir_declare_function
          (irGenerator *this,string *_name,SymbolKind kind)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  mapped_type mVar3;
  int iVar4;
  mapped_type *pmVar5;
  VoidTy *pVVar6;
  FunctionTy *this_01;
  MirFunction *this_02;
  iterator iVar7;
  mapped_type *pmVar8;
  IntTy *pIVar9;
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  *this_03;
  JumpLabelId *__p;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
  *this_04;
  undefined1 local_208 [8];
  Variable VStack_200;
  SharedTyPtr ret;
  shared_ptr<mir::inst::MirFunction> func;
  shared_ptr<mir::types::FunctionTy> type;
  undefined1 local_198 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_190 [4];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *local_170;
  SharedTyPtr local_168;
  SharedTyPtr local_158;
  __shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> local_148;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_> params;
  __shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2> local_110;
  string name;
  vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  local_e0;
  string local_c8;
  string local_a8;
  FunctionData local_88;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  func.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  func.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  type.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  type.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  params.
  super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._localValueNameToId._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._localValueNameToId._M_t._M_impl.super__Rb_tree_header._M_header;
  local_88._localValueNameToId._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  ret.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ret.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88._localValueNameToId._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  params.
  super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  params.
  super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._localValueNameToId._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._freeList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._freeList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._freeList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = this->_InitLocalVarId;
  uVar2 = this->_InitTmpVarId;
  local_88._nowLocalValueId = uVar1;
  local_88._nowTmpId = uVar2;
  local_88._frontInstsNum = 0;
  this_04 = &this->_funcNameToFuncData;
  local_88._localValueNameToId._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._localValueNameToId._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](this_04,_name);
  FunctionData::operator=(pmVar5,&local_88);
  if (kind == INT) {
    pIVar9 = (IntTy *)operator_new(8);
    (pIVar9->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dad68;
    std::__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mir::types::IntTy,void>
              ((__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2> *)local_208,pIVar9);
  }
  else {
    if (kind != VID) goto LAB_00169fec;
    pVVar6 = (VoidTy *)operator_new(8);
    (pVVar6->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dadc0;
    std::__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mir::types::VoidTy,void>
              ((__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2> *)local_208,pVVar6);
  }
  std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&ret.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> *)local_208);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8));
LAB_00169fec:
  std::__cxx11::string::_M_assign((string *)&name);
  this_01 = (FunctionTy *)operator_new(0x38);
  std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_148,&ret.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>);
  std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
  vector(&local_e0,&params);
  mir::types::FunctionTy::FunctionTy(this_01,(SharedTyPtr *)&local_148,&local_e0,false);
  std::__shared_ptr<mir::types::FunctionTy,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mir::types::FunctionTy,void>
            ((__shared_ptr<mir::types::FunctionTy,(__gnu_cxx::_Lock_policy)2> *)local_208,this_01);
  std::__shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&type.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2> *)local_208);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8));
  std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
  ~vector(&local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
  this_02 = (MirFunction *)operator_new(0x98);
  std::__cxx11::string::string((string *)&local_a8,(string *)&name);
  std::__shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_110,&type.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>
            );
  mir::inst::MirFunction::MirFunction
            (this_02,&local_a8,(shared_ptr<mir::types::FunctionTy> *)&local_110);
  std::__shared_ptr<mir::inst::MirFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mir::inst::MirFunction,void>
            ((__shared_ptr<mir::inst::MirFunction,(__gnu_cxx::_Lock_policy)2> *)local_208,this_02);
  std::__shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&func.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2> *)local_208);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_c8,(string *)&name);
  std::__shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_120,&func.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>
            );
  insertFunc(this,&local_c8,(shared_ptr<mir::inst::MirFunction> *)&local_120);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  std::__cxx11::string::~string((string *)&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->_funcStack,
              &(func.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->name);
  this_00 = &(this->_package).functions;
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
          ::find(&this_00->_M_t,
                 (this->_funcStack).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
  local_170 = this_00;
  pVVar6 = (VoidTy *)operator_new(8);
  (pVVar6->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dadc0;
  std::__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mir::types::VoidTy,void>
            ((__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2> *)&local_158,pVVar6);
  mir::inst::Variable::Variable((Variable *)local_198,&local_158,false,false,false);
  std::pair<int,_mir::inst::Variable>::pair<mir::inst::Variable,_true>
            ((pair<int,_mir::inst::Variable> *)local_208,&this->_VoidVarId,(Variable *)local_198);
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
  ::_M_emplace_unique<std::pair<int,mir::inst::Variable>>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
              *)&iVar7._M_node[3]._M_right,(pair<int,_mir::inst::Variable> *)local_208);
  mir::inst::Variable::~Variable((Variable *)(local_208 + 8));
  mir::inst::Variable::~Variable((Variable *)local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_158.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  mVar3 = this->_VoidVarId;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](this_04,(this->_funcStack).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&pmVar5->_localValueNameToId,&this->_VoidVarName);
  *pmVar8 = mVar3;
  if (kind == INT) {
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
            ::find(&local_170->_M_t,
                   (this->_funcStack).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
    pIVar9 = (IntTy *)operator_new(8);
    (pIVar9->super_Ty).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dad68;
    std::__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mir::types::IntTy,void>
              ((__shared_ptr<mir::types::Ty,(__gnu_cxx::_Lock_policy)2> *)&local_168,pIVar9);
    mir::inst::Variable::Variable((Variable *)local_198,&local_168,false,false,false);
    std::pair<int,_mir::inst::Variable>::pair<mir::inst::Variable,_true>
              ((pair<int,_mir::inst::Variable> *)local_208,&this->_ReturnVarId,(Variable *)local_198
              );
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
    ::_M_emplace_unique<std::pair<int,mir::inst::Variable>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
                *)&iVar7._M_node[3]._M_right,(pair<int,_mir::inst::Variable> *)local_208);
    mir::inst::Variable::~Variable((Variable *)(local_208 + 8));
    mir::inst::Variable::~Variable((Variable *)local_198);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_168.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    mVar3 = this->_ReturnVarId;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
             ::operator[](this_04,(this->_funcStack).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -1);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&pmVar5->_localValueNameToId,&this->_ReturnVarName);
    *pmVar8 = mVar3;
  }
  this_03 = (vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
               ::operator[](&this->_funcNameToInstructions,
                            (this->_funcStack).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
  __p = (JumpLabelId *)operator_new(4);
  iVar4 = this->_nowLabelId;
  this->_nowLabelId = iVar4 + 1;
  __p->_jumpLabelId = iVar4;
  std::__shared_ptr<front::irGenerator::JumpLabelId,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<front::irGenerator::JumpLabelId,void>
            ((__shared_ptr<front::irGenerator::JumpLabelId,(__gnu_cxx::_Lock_policy)2> *)local_198,
             __p);
  local_208 = local_198;
  VStack_200.super_Displayable._vptr_Displayable = (_func_int **)a_Stack_190[0]._M_pi;
  _local_198 = (undefined1  [16])0x0;
  VStack_200.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ = '\x02'
  ;
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  ::
  emplace_back<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>
            (this_03,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      *)local_208);
  std::__detail::__variant::
  _Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  ::~_Variant_storage((_Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                       *)local_208);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8));
  FunctionData::~FunctionData(&local_88);
  std::vector<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>::
  ~vector(&params);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&type.super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&func.super___shared_ptr<mir::inst::MirFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void irGenerator::ir_declare_function(string _name, symbol::SymbolKind kind) {
  string name;
  shared_ptr<mir::inst::MirFunction> func;
  shared_ptr<FunctionTy> type;
  SharedTyPtr ret;
  std::vector<SharedTyPtr> params;
  FunctionData functionData;

  functionData._nowLocalValueId = _InitLocalVarId;
  functionData._nowTmpId = _InitTmpVarId;
  functionData._frontInstsNum = 0;
  _funcNameToFuncData[_name] = functionData;

  switch (kind) {
    case front::symbol::SymbolKind::INT:
      ret = SharedTyPtr(new IntTy());
      break;
    case front::symbol::SymbolKind::VID:
      ret = SharedTyPtr(new VoidTy());
      break;
    default:
      break;
  }
  name = _name;
  type = shared_ptr<FunctionTy>(new FunctionTy(ret, params, false));
  func = shared_ptr<mir::inst::MirFunction>(
      new mir::inst::MirFunction(name, type));

  insertFunc(name, func);
  _funcStack.push_back(func->name);

  _package.functions.find(_funcStack.back())
      ->second.variables.insert(std::pair(
          _VoidVarId, Variable(SharedTyPtr(new VoidTy()), false, false)));
  _funcNameToFuncData[_funcStack.back()]._localValueNameToId[_VoidVarName] =
      _VoidVarId;
  if (kind == front::symbol::SymbolKind::INT) {
    _package.functions.find(_funcStack.back())
        ->second.variables.insert(std::pair(
            _ReturnVarId, Variable(SharedTyPtr(new IntTy()), false, false)));
    _funcNameToFuncData[_funcStack.back()]._localValueNameToId[_ReturnVarName] =
        _ReturnVarId;
  }
  _funcNameToInstructions[_funcStack.back()].push_back(
      shared_ptr<JumpLabelId>(new JumpLabelId(getNewLabelId())));
}